

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O1

void __thiscall
capnp::EzRpcClient::Impl::Impl
          (Impl *this,sockaddr *serverAddress,uint addrSize,ReaderOptions readerOpts)

{
  NetworkAddress *pNVar1;
  undefined8 uVar2;
  PromiseNode *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  Own<kj::NetworkAddress> local_80;
  undefined1 local_70 [24];
  PromiseNode *pPStack_58;
  Own<kj::_::PromiseNode> local_50;
  Impl *local_40;
  uint64_t local_38;
  int local_30;
  
  EzRpcContext::getThreadLocal();
  iVar4 = (*((((this->context).ptr)->ioContext).provider.ptr)->_vptr_AsyncIoProvider[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 8))
            (&local_80,(long *)CONCAT44(extraout_var,iVar4),serverAddress,addrSize);
  connectAttach((capnp *)local_70,&local_80);
  local_30 = readerOpts.nestingLimit;
  local_40 = this;
  local_38 = readerOpts.traversalLimitInWords;
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::AsyncIoStream>,capnp::EzRpcClient::Impl::Impl(sockaddr_const*,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::AsyncIoStream>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::EzRpcClient::Impl::Impl(sockaddr_const*,unsigned_int,capnp::ReaderOptions)::_lambda(kj::Own<kj::AsyncIoStream>&&)_1_,kj::_::PropagateException>
            (&local_50,(anon_class_24_2_846dc7fe_for_func *)local_70,(PropagateException *)&local_40
            );
  local_70._16_8_ = local_50.disposer;
  pPStack_58 = local_50.ptr;
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  pPVar3 = pPStack_58;
  if (pPStack_58 != (PromiseNode *)0x0) {
    pPStack_58 = (PromiseNode *)0x0;
    (***(_func_int ***)local_70._16_8_)
              (local_70._16_8_,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
  }
  uVar2 = local_70._8_8_;
  if ((long *)local_70._8_8_ != (long *)0x0) {
    local_70._8_8_ = (long *)0x0;
    (*(code *)((Own<capnp::EzRpcContext> *)local_70._0_8_)->disposer->_vptr_Disposer)
              (local_70._0_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
  }
  pNVar1 = local_80.ptr;
  if (local_80.ptr != (NetworkAddress *)0x0) {
    local_80.ptr = (NetworkAddress *)0x0;
    (**(local_80.disposer)->_vptr_Disposer)
              (local_80.disposer,
               pNVar1->_vptr_NetworkAddress[-2] + (long)&pNVar1->_vptr_NetworkAddress);
  }
  (this->clientContext).ptr.disposer = (Disposer *)0x0;
  (this->clientContext).ptr.ptr = (ClientContext *)0x0;
  return;
}

Assistant:

Impl(const struct sockaddr* serverAddress, uint addrSize,
       ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(
            connectAttach(context->getIoProvider().getNetwork()
                .getSockaddr(serverAddress, addrSize))
            .then([this, readerOpts](kj::Own<kj::AsyncIoStream>&& stream) {
              clientContext = kj::heap<ClientContext>(kj::mv(stream),
                                                      readerOpts);
            }).fork()) {}